

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FboCases::TexSubImageBetweenRenderTest::TexSubImageBetweenRenderTest
          (TexSubImageBetweenRenderTest *this,Context *context,FboConfig *config)

{
  char *name;
  string local_98;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  FboConfig *local_20;
  FboConfig *config_local;
  Context *context_local;
  TexSubImageBetweenRenderTest *this_local;
  
  local_20 = config;
  config_local = (FboConfig *)context;
  context_local = (Context *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"between_render_",&local_61);
  FboConfig::getName_abi_cxx11_(&local_98,local_20);
  std::operator+(&local_40,&local_60,&local_98);
  name = (char *)std::__cxx11::string::c_str();
  FboRenderCase::FboRenderCase
            (&this->super_FboRenderCase,context,name,"TexSubImage between rendering calls",local_20)
  ;
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TexSubImageBetweenRenderTest_03291d10;
  return;
}

Assistant:

TexSubImageBetweenRenderTest::TexSubImageBetweenRenderTest (Context& context, const FboConfig& config)
	: FboRenderCase(context, (string("between_render_") + config.getName()).c_str(), "TexSubImage between rendering calls", config)
{
}